

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

void SstFFSMarshal(SstStream Stream,void *Variable,char *Name,int Type,size_t ElemSize,
                  size_t DimCount,size_t *Shape,size_t *Count,size_t *Offsets,void *Data)

{
  FMFieldList *FieldP;
  int *CountP;
  int *piVar1;
  FFSMetadataInfoStruct *MBase;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *Name_00;
  char *pcVar8;
  char *__s;
  size_t *psVar9;
  void *pvVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long *plVar15;
  
  piVar1 = (int *)Stream->WriterMarshalData;
  if ((piVar1 != (int *)0x0) && (lVar12 = (long)*piVar1, 0 < lVar12)) {
    plVar15 = *(long **)(piVar1 + 2);
    do {
      if ((void *)*plVar15 == Variable) goto LAB_007454d7;
      plVar15 = plVar15 + 5;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  plVar15 = (long *)0x0;
LAB_007454d7:
  if (plVar15 == (long *)0x0) {
    if (piVar1 == (int *)0x0) {
      InitMarshalData(Stream);
    }
    piVar1 = (int *)Stream->WriterMarshalData;
    pvVar3 = realloc(*(void **)(piVar1 + 2),(long)*piVar1 * 0x28 + 0x28);
    *(void **)(piVar1 + 2) = pvVar3;
    iVar2 = *piVar1;
    plVar15 = (long *)((long)pvVar3 + (long)iVar2 * 0x28);
    *plVar15 = (long)Variable;
    *(int *)(plVar15 + 1) = iVar2;
    *(int *)(plVar15 + 4) = (int)DimCount;
    *(int *)((long)plVar15 + 0x24) = Type;
    if (DimCount == 0) {
      pcVar5 = ConcatName(Name,"");
      pcVar6 = TranslateADIOS2Type2FFS(Type);
      AddSimpleField((FMFieldList *)(piVar1 + 8),piVar1 + 6,pcVar5,pcVar6,(int)ElemSize);
      free(pcVar6);
      free(pcVar5);
      RecalcMarshalStorageSize(Stream);
      plVar15[3] = (long)*(int *)(*(long *)(piVar1 + 8) + -4 + (long)piVar1[6] * 0x18);
      plVar15[2] = -1;
      lVar12 = 0x28;
    }
    else {
      sVar4 = strlen(Name);
      pcVar5 = (char *)malloc(sVar4 + 0x17);
      snprintf(pcVar5,sVar4 + 0x17,"SST%d_%d_",ElemSize,(ulong)(uint)Type);
      strcat(pcVar5,Name);
      sVar4 = strlen(pcVar5);
      builtin_strncpy(pcVar5 + sVar4,"Dims",5);
      sVar4 = strlen(Name);
      pcVar6 = (char *)malloc(sVar4 + 0x17);
      snprintf(pcVar6,sVar4 + 0x17,"SST%d_%d_",ElemSize,(ulong)(uint)Type);
      strcat(pcVar6,Name);
      sVar4 = strlen(pcVar6);
      builtin_strncpy(pcVar6 + sVar4,"DBCount",8);
      FieldP = (FMFieldList *)(piVar1 + 8);
      CountP = piVar1 + 6;
      pcVar7 = strdup("integer");
      AddSimpleField(FieldP,CountP,pcVar5,pcVar7,8);
      free(pcVar7);
      free(pcVar5);
      plVar15[3] = (long)*(int *)(*(long *)(piVar1 + 8) + -4 + (long)piVar1[6] * 0x18);
      pcVar5 = ConcatName(Name,"Shape");
      pcVar7 = ConcatName(Name,"Count");
      Name_00 = ConcatName(Name,"Offsets");
      pcVar8 = strdup("integer");
      AddSimpleField(FieldP,CountP,pcVar6,pcVar8,8);
      free(pcVar8);
      pcVar8 = strdup("integer");
      sVar4 = strlen(pcVar8);
      __s = (char *)malloc(sVar4 + 0x10);
      snprintf(__s,sVar4 + 0x10,"*(%s[%d])",pcVar8,DimCount & 0xffffffff);
      free(pcVar8);
      AddSimpleField(FieldP,CountP,pcVar5,__s,8);
      free(__s);
      *(undefined4 *)(*(long *)(piVar1 + 8) + -8 + (long)piVar1[6] * 0x18) = 8;
      AddVarArrayField(FieldP,CountP,pcVar7,4,8,pcVar6);
      AddVarArrayField(FieldP,CountP,Name_00,4,8,pcVar6);
      free(pcVar6);
      free(pcVar5);
      free(pcVar7);
      free(Name_00);
      RecalcMarshalStorageSize(Stream);
      pcVar5 = ConcatName(Name,"ElemCount");
      pcVar6 = strdup("integer");
      AddSimpleField((FMFieldList *)(piVar1 + 0xe),piVar1 + 0xc,pcVar5,pcVar6,8);
      free(pcVar6);
      plVar15[2] = (long)*(int *)(*(long *)(piVar1 + 0xe) + -4 + (long)piVar1[0xc] * 0x18);
      pcVar6 = ConcatName(Name,"");
      AddVarArrayField((FMFieldList *)(piVar1 + 0xe),piVar1 + 0xc,pcVar6,Type,(int)ElemSize,pcVar5);
      free(pcVar6);
      free(pcVar5);
      RecalcMarshalStorageSize(Stream);
      piVar1[10] = 0;
      piVar1[0xb] = 0;
      lVar12 = 0x40;
    }
    *(undefined8 *)((long)piVar1 + lVar12) = 0;
    *piVar1 = *piVar1 + 1;
  }
  MBase = (FFSMetadataInfoStruct *)Stream->M;
  iVar2 = FFSBitfieldTest(MBase,(int)plVar15[1]);
  lVar12 = plVar15[1];
  uVar14 = (ulong)((int)lVar12 >> 6);
  if (MBase->BitFieldCount <= uVar14) {
    psVar9 = (size_t *)realloc(MBase->BitField,uVar14 * 8 + 8);
    MBase->BitField = psVar9;
    memset(psVar9 + MBase->BitFieldCount,0,(uVar14 - MBase->BitFieldCount) * 8 + 8);
    MBase->BitFieldCount = uVar14 + 1;
  }
  MBase->BitField[uVar14] = MBase->BitField[uVar14] | 1L << ((byte)(int)lVar12 & 0x3f);
  psVar9 = (size_t *)((long)Stream->M + plVar15[3]);
  if ((int)plVar15[4] != 0) {
    pvVar3 = Stream->D;
    lVar12 = plVar15[2];
    *psVar9 = DimCount;
    if (iVar2 == 0) {
      if (Shape == (size_t *)0x0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = malloc(DimCount * 8);
        memcpy(pvVar10,Shape,DimCount * 8);
      }
      psVar9[2] = (size_t)pvVar10;
      psVar9[1] = DimCount;
      sVar4 = DimCount * 8;
      pvVar10 = malloc(sVar4);
      memcpy(pvVar10,Count,sVar4);
      psVar9[3] = (size_t)pvVar10;
      if (Offsets == (size_t *)0x0) {
        psVar9[4] = 0;
      }
      else {
        pvVar10 = malloc(sVar4);
        memcpy(pvVar10,Offsets,sVar4);
        psVar9[4] = (size_t)pvVar10;
      }
    }
    else {
      sVar11 = psVar9[1];
      psVar9[1] = DimCount + sVar11;
      sVar4 = (DimCount + sVar11) * 8;
      pvVar10 = realloc((void *)psVar9[3],sVar4);
      memcpy((void *)((long)pvVar10 + sVar11 * 8),Count,DimCount * 8);
      psVar9[3] = (size_t)pvVar10;
      if (Offsets != (size_t *)0x0) {
        pvVar10 = realloc((void *)psVar9[4],sVar4);
        memcpy((void *)((long)pvVar10 + sVar11 * 8),Offsets,DimCount * 8);
        psVar9[4] = (size_t)pvVar10;
      }
    }
    if (iVar2 != 0) {
      lVar13 = 1;
      if (DimCount != 0) {
        sVar11 = 0;
        do {
          lVar13 = lVar13 * Count[sVar11];
          sVar11 = sVar11 + 1;
        } while (DimCount != sVar11);
      }
      pvVar10 = realloc(*(void **)((long)pvVar3 + lVar12 + 8),
                        (*(long *)((long)pvVar3 + lVar12) + lVar13) * ElemSize);
      *(void **)((long)pvVar3 + lVar12 + 8) = pvVar10;
      memcpy((void *)(ElemSize * *(long *)((long)pvVar3 + lVar12) + (long)pvVar10),Data,
             lVar13 * ElemSize);
      *(long *)((long)pvVar3 + lVar12) = *(long *)((long)pvVar3 + lVar12) + lVar13;
      return;
    }
    lVar13 = 1;
    if (DimCount != 0) {
      sVar11 = 0;
      do {
        lVar13 = lVar13 * Count[sVar11];
        sVar11 = sVar11 + 1;
      } while (DimCount != sVar11);
    }
    *(long *)((long)pvVar3 + lVar12) = lVar13;
    ElemSize = ElemSize * lVar13;
    psVar9 = (size_t *)malloc(ElemSize);
    *(size_t **)((long)pvVar3 + lVar12 + 8) = psVar9;
  }
  memcpy(psVar9,Data,ElemSize);
  return;
}

Assistant:

extern void SstFFSMarshal(SstStream Stream, void *Variable, const char *Name, const int Type,
                          size_t ElemSize, size_t DimCount, const size_t *Shape,
                          const size_t *Count, const size_t *Offsets, const void *Data)
{

    struct FFSMetadataInfoStruct *MBase;

    FFSWriterRec Rec = LookupWriterRec(Stream, Variable);
    if (!Rec)
    {
        Rec = CreateWriterRec(Stream, Variable, Name, Type, ElemSize, DimCount);
    }

    MBase = Stream->M;
    int AlreadyWritten = FFSBitfieldTest(MBase, Rec->FieldID);
    FFSBitfieldSet(MBase, Rec->FieldID);

    if (Rec->DimCount == 0)
    {
        memcpy((char *)(Stream->M) + Rec->MetaOffset, Data, ElemSize);
    }
    else
    {
        MetaArrayRec *MetaEntry = (MetaArrayRec *)((char *)(Stream->M) + Rec->MetaOffset);
        ArrayRec *DataEntry = (ArrayRec *)((char *)(Stream->D) + Rec->DataOffset);

        /* handle metadata */
        MetaEntry->Dims = DimCount;
        if (!AlreadyWritten)
        {
            if (Shape)
                MetaEntry->Shape = CopyDims(DimCount, Shape);
            else
                MetaEntry->Shape = NULL;
            MetaEntry->DBCount = DimCount;
            MetaEntry->Count = CopyDims(DimCount, Count);
            if (Offsets)
                MetaEntry->Offsets = CopyDims(DimCount, Offsets);
            else
                MetaEntry->Offsets = NULL;
        }
        else
        {
            /* already got some metadata, add blocks */
            size_t PreviousDBCount = MetaEntry->DBCount;
            //  Assume shape is still valid   (modify this if shape /global
            //  dimensions can change )
            // Also assume Dims is always right and consistent, otherwise, bad
            // things
            MetaEntry->DBCount += DimCount;
            MetaEntry->Count = AppendDims(MetaEntry->Count, PreviousDBCount, DimCount, Count);
            if (Offsets)
                MetaEntry->Offsets =
                    AppendDims(MetaEntry->Offsets, PreviousDBCount, DimCount, Offsets);
        }

        if ((Stream->ConfigParams->CompressionMethod == SstCompressZFP) &&
            ZFPcompressionPossible(Type, DimCount))
        {
#ifdef ADIOS2_HAVE_ZFP
            /* this should never be true if ZFP is not available */
            size_t ByteCount;
            char *Output =
                FFS_ZFPCompress(Stream, Rec->DimCount, Rec->Type, (void *)Data, Count, &ByteCount);
            DataEntry->ElemCount = ByteCount;
            DataEntry->Array = Output;
#endif
        }
        else
        {
            if (!AlreadyWritten)
            {
                /* normal array case */
                size_t ElemCount = CalcSize(DimCount, Count);
                DataEntry->ElemCount = ElemCount;
                /* this is PutSync case, so we have to copy the data NOW */
                DataEntry->Array = malloc(ElemCount * ElemSize);
                memcpy(DataEntry->Array, Data, ElemCount * ElemSize);
            }
            else
            {
                size_t ElemCount = CalcSize(DimCount, Count);
                /* this is PutSync case, so we have to copy the data NOW */
                DataEntry->Array =
                    realloc(DataEntry->Array, (DataEntry->ElemCount + ElemCount) * ElemSize);
                memcpy((char *)DataEntry->Array + DataEntry->ElemCount * ElemSize, Data,
                       ElemCount * ElemSize);
                DataEntry->ElemCount += ElemCount;
            }
        }
    }
}